

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

TokenStream * __thiscall Catch::Clara::Detail::TokenStream::operator++(TokenStream *this)

{
  bool bVar1;
  size_type sVar2;
  __normal_iterator<Catch::Clara::Detail::Token_*,_std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>_>
  local_20;
  const_iterator local_18;
  TokenStream *local_10;
  TokenStream *this_local;
  
  local_10 = this;
  sVar2 = std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
          size(&this->m_tokenBuffer);
  if (sVar2 < 2) {
    bVar1 = __gnu_cxx::operator!=(&this->it,&this->itEnd);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&this->it);
    }
    loadBuffer(this);
  }
  else {
    local_20._M_current =
         (Token *)std::
                  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                  ::begin(&this->m_tokenBuffer);
    __gnu_cxx::
    __normal_iterator<Catch::Clara::Detail::Token_const*,std::vector<Catch::Clara::Detail::Token,std::allocator<Catch::Clara::Detail::Token>>>
    ::__normal_iterator<Catch::Clara::Detail::Token*>
              ((__normal_iterator<Catch::Clara::Detail::Token_const*,std::vector<Catch::Clara::Detail::Token,std::allocator<Catch::Clara::Detail::Token>>>
                *)&local_18,&local_20);
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::erase
              (&this->m_tokenBuffer,local_18);
  }
  return this;
}

Assistant:

TokenStream& TokenStream::operator++() {
                if ( m_tokenBuffer.size() >= 2 ) {
                    m_tokenBuffer.erase( m_tokenBuffer.begin() );
                } else {
                    if ( it != itEnd )
                        ++it;
                    loadBuffer();
                }
                return *this;
            }